

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Once::reset(Once *this)

{
  Fault local_28;
  Fault f;
  uint state;
  Once *this_local;
  
  LOCK();
  f.exception._7_1_ = *(int *)this == 3;
  if ((bool)f.exception._7_1_) {
    *(undefined4 *)this = 0;
  }
  UNLOCK();
  if (!(bool)f.exception._7_1_) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
               ,0x23c,FAILED,(char *)0x0,"\"reset() called while not initialized.\"",
               (char (*) [38])"reset() called while not initialized.");
    Debug::Fault::fatal(&local_28);
  }
  return;
}

Assistant:

void Once::reset() {
  uint state = INITIALIZED;
  if (!__atomic_compare_exchange_n(&futex, &state, UNINITIALIZED,
                                   false, __ATOMIC_RELEASE, __ATOMIC_RELAXED)) {
    KJ_FAIL_REQUIRE("reset() called while not initialized.");
  }
}